

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void __thiscall vkt::sr::anon_unknown_0::ShaderMatrixCase::setupShader(ShaderMatrixCase *this)

{
  uint uVar1;
  uint uVar2;
  DataType DVar3;
  MatrixOp op;
  DataType DVar4;
  OperationType OVar5;
  int iVar6;
  int iVar7;
  DataType DVar8;
  ostream *poVar9;
  size_t sVar10;
  undefined8 *puVar11;
  char **ppcVar12;
  long *plVar13;
  string *psVar14;
  ostream *poVar15;
  size_type *psVar16;
  undefined4 *puVar17;
  long lVar18;
  ShaderMatrixCase *pSVar19;
  int row;
  int precision;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  char *pcVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar21;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  int ndx;
  undefined1 *puVar22;
  string *psVar23;
  int rowNdx;
  int col_1;
  char *pcVar24;
  string *psVar25;
  ulong uVar26;
  int colNdx;
  long lVar27;
  pointer pbVar28;
  ostringstream *this_00;
  bool bVar29;
  bool bVar30;
  DataType resultType;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  ostringstream s;
  string inValue0;
  string inValue1;
  string operationValue1;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_668 [4];
  DataType local_664;
  ShaderMatrixCase *local_660;
  string local_658;
  char *local_630;
  Precision local_624;
  long local_620;
  char *local_618;
  ulong *local_610;
  long local_608;
  ulong local_600 [2];
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0 [2];
  ulong local_5d0;
  int local_5c4;
  string *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char local_5a8;
  undefined7 uStack_5a7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  string local_578;
  ulong local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  ios_base local_508 [272];
  char *local_3f8;
  long local_3f0;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  undefined4 *local_3d8;
  undefined4 *local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 *local_3b8;
  undefined4 *local_3b0;
  undefined4 *local_3a8;
  undefined4 *local_3a0;
  undefined4 *local_398;
  undefined4 *local_390;
  char *local_388;
  long local_380;
  char local_378;
  undefined7 uStack_377;
  char *local_368;
  undefined8 local_360;
  char local_358;
  undefined7 uStack_357;
  char *local_348;
  undefined8 local_340;
  char local_338;
  undefined7 uStack_337;
  ulong local_328;
  long local_320 [14];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_00 = local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    this_00 = (ostringstream *)local_320;
  }
  DVar8 = (this->m_in0).dataType;
  local_630 = (char *)(ulong)DVar8;
  DVar3 = (this->m_in1).dataType;
  local_620 = CONCAT44(local_620._4_4_,DVar8 - TYPE_FLOAT_MAT2);
  uVar1 = DVar3 - TYPE_FLOAT_MAT2;
  uVar2 = DVar3 - TYPE_DOUBLE_MAT2;
  local_388 = &local_378;
  local_380 = 0;
  local_378 = '\0';
  local_368 = &local_358;
  local_360 = 0;
  local_358 = '\0';
  local_664 = TYPE_LAST;
  local_624 = (this->m_in0).precision;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  op = this->m_op;
  local_660 = this;
  OVar5 = MatrixCaseUtils::getOperationType(op);
  local_3f0 = 1;
  if (OVar5 < OPERATIONTYPE_LAST) {
    local_3f0 = *(long *)(&DAT_00b4c610 + (ulong)OVar5 * 8);
  }
  local_5b8 = &local_5a8;
  local_5b0 = (char *)0x0;
  local_5a8 = '\0';
  local_348 = &local_338;
  local_340 = 0;
  local_338 = '\0';
  if (((op == OP_MUL) && ((uint)local_620 < 9 || DVar8 - TYPE_DOUBLE_MAT2 < 9)) &&
     (uVar1 < 9 || uVar2 < 9)) {
    iVar6 = glu::getDataTypeMatrixNumColumns(DVar3);
    iVar7 = glu::getDataTypeMatrixNumRows((local_660->m_in0).dataType);
    DVar8 = glu::getDataTypeMatrix(iVar6,iVar7);
  }
  else {
    switch(op) {
    case OP_OUTER_PRODUCT:
      iVar6 = glu::getDataTypeScalarSize(DVar3);
      iVar7 = glu::getDataTypeScalarSize((local_660->m_in0).dataType);
      DVar8 = glu::getDataTypeMatrix(iVar6,iVar7);
      break;
    case OP_TRANSPOSE:
      iVar6 = glu::getDataTypeMatrixNumRows((DataType)local_630);
      iVar7 = glu::getDataTypeMatrixNumColumns((local_660->m_in0).dataType);
      DVar8 = glu::getDataTypeMatrix(iVar6,iVar7);
      break;
    case OP_DETERMINANT:
      local_664 = TYPE_FLOAT;
      DVar8 = local_664;
      break;
    default:
      if ((OVar5 & ~OPERATIONTYPE_BINARY_FUNCTION) != OPERATIONTYPE_UNARY_PREFIX_OPERATOR) {
        bVar30 = 8 < DVar8 - TYPE_DOUBLE_MAT2;
        bVar29 = 8 < (uint)local_620;
        if ((bVar29 && bVar30) || (8 < uVar1 && 8 < uVar2)) {
          DVar8 = local_664;
          if ((uVar1 < 9 || uVar2 < 9) || (!bVar29 || !bVar30)) {
            DVar3 = (local_660->m_in0).dataType;
            DVar8 = (local_660->m_in1).dataType;
            DVar4 = DVar3;
            if (!bVar29 || !bVar30) {
              DVar4 = DVar8;
              DVar8 = DVar3;
            }
            if (DVar4 != TYPE_FLOAT) {
              if (bVar29 && bVar30) {
                iVar6 = glu::getDataTypeMatrixNumColumns(DVar8);
              }
              else {
                iVar6 = glu::getDataTypeMatrixNumRows(DVar8);
              }
              DVar8 = glu::getDataTypeFloatVec(iVar6);
            }
          }
          break;
        }
      }
    case OP_INVERSE:
      DVar8 = (DataType)local_630;
    }
  }
  local_664 = DVar8;
  if ((sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                                   header_abi_cxx11_), iVar6 != 0)) {
    sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_._M_dataplus._M_p =
         (pointer)&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
               "#version 310 es\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                         header_abi_cxx11_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_dataplus._M_p,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_dataplus._M_p,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  if ((local_660->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in mediump vec4 v_color;\n",0x2e);
  }
  lVar18 = 0;
  local_3a8 = &sr::(anonymous_namespace)::s_constInMat4x4;
  local_3b0 = &sr::(anonymous_namespace)::s_constInMat4x3;
  local_3b8 = &sr::(anonymous_namespace)::s_constInMat4x2;
  local_3c0 = &sr::(anonymous_namespace)::s_constInMat3x4;
  local_3c8 = &sr::(anonymous_namespace)::s_constInMat3x3;
  local_3d0 = &sr::(anonymous_namespace)::s_constInMat3x2;
  local_3d8 = &sr::(anonymous_namespace)::s_constInMat2x4;
  local_3e0 = &sr::(anonymous_namespace)::s_constInMat2x3;
  local_3e8 = &sr::(anonymous_namespace)::s_constInMat2x2;
  local_390 = &sr::(anonymous_namespace)::s_constInVec4;
  local_398 = &sr::(anonymous_namespace)::s_constInVec3;
  local_3a0 = &sr::(anonymous_namespace)::s_constInVec2;
  local_3f8 = ";\n";
  local_5c4 = 0;
  local_5d0 = 0;
  do {
    pSVar19 = local_660;
    lVar27 = 0xec;
    if (lVar18 == 0) {
      lVar27 = 0xe0;
    }
    local_620 = lVar18;
    local_618 = glu::getPrecisionName
                          (*(Precision *)
                            ((long)&(local_660->super_ShaderRenderCase).super_TestCase.
                                    super_TestCase.super_TestNode.m_testCtx + lVar27));
    local_630 = glu::getDataTypeName
                          (*(DataType *)
                            ((long)&(pSVar19->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                    super_TestNode._vptr_TestNode + lVar27 + 4));
    local_5c0 = (string *)&local_368;
    if (local_620 == 0) {
      local_5c0 = (string *)&local_388;
    }
    iVar6 = *(int *)((long)&(pSVar19->super_ShaderRenderCase).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar27);
    iVar7 = (int)this_00;
    if (iVar6 != 0) {
      if (iVar6 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"layout(std140, set = 0, binding = ",0x22);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") uniform buffer",0x10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_620);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," { ",3);
        pcVar24 = local_618;
        if (local_618 == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
        }
        else {
          sVar10 = strlen(local_618);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        pcVar24 = local_630;
        if (local_630 == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
        }
        else {
          sVar10 = strlen(local_630);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," u_in",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_620);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; };\n",5);
        local_610 = local_600;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"u_in","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_578);
        std::ostream::operator<<(&local_578,(int)local_620);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_578);
        std::ios_base::~ios_base(local_508);
        uVar26 = 0xf;
        if (local_610 != local_600) {
          uVar26 = local_600[0];
        }
        if (uVar26 < (ulong)(local_5e8 + local_608)) {
          uVar26 = 0xf;
          if (local_5f0 != local_5e0) {
            uVar26 = local_5e0[0];
          }
          if (uVar26 < (ulong)(local_5e8 + local_608)) goto LAB_005c18b7;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_5f0,0,(char *)0x0,(ulong)local_610);
        }
        else {
LAB_005c18b7:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_610,(ulong)local_5f0);
        }
        local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
        psVar16 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_658.field_2._M_allocated_capacity = *psVar16;
          local_658.field_2._8_8_ = puVar11[3];
        }
        else {
          local_658.field_2._M_allocated_capacity = *psVar16;
          local_658._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_658._M_string_length = puVar11[1];
        *puVar11 = psVar16;
        puVar11[1] = 0;
        *(undefined1 *)psVar16 = 0;
        std::__cxx11::string::operator=(local_5c0,(string *)&local_658);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != &local_658.field_2) {
          operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
        }
        if (local_5f0 != local_5e0) {
          operator_delete(local_5f0,local_5e0[0] + 1);
        }
        if (local_610 != local_600) {
          operator_delete(local_610,local_600[0] + 1);
        }
        local_5c4 = local_5c4 + 1;
      }
      else if (iVar6 == 2) {
        iVar6 = *(int *)((long)&(local_660->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar27 + 4);
        if (iVar6 - 5U < 9 || iVar6 - 0x12U < 9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"layout(location = ",0x12);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in ",5);
          pcVar24 = local_618;
          if (local_618 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar10 = strlen(local_618);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          pcVar24 = local_630;
          if (local_630 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar10 = strlen(local_630);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," a_",3);
          pcVar24 = local_630;
          if (local_630 == (char *)0x0) {
            std::ios::clear((int)auStack_668 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x348);
          }
          else {
            sVar10 = strlen(local_630);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar24,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
          if ((local_660->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"layout(location = ",0x12);
            local_328 = (ulong)((int)local_620 + (int)local_5d0 + 1);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") out ",6);
            pcVar24 = local_618;
            iVar6 = (int)poVar9;
            if (local_618 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + iVar6);
            }
            else {
              sVar10 = strlen(local_618);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + iVar6);
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," v_",3);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"layout(location = ",0x12);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in ",5);
            pcVar24 = local_618;
            iVar6 = (int)poVar9;
            if (local_618 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + iVar6);
            }
            else {
              sVar10 = strlen(local_618);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + iVar6);
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," v_",3);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_578,local_630,(allocator<char> *)&local_658);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_598,&local_578);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pSVar19 = local_660;
          bVar30 = (local_660->super_ShaderRenderCase).m_isVertexCase != false;
          pcVar24 = "v_";
          if (bVar30) {
            pcVar24 = "a_";
          }
          local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
          pcVar20 = "";
          if (bVar30) {
            pcVar20 = "";
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,pcVar24,pcVar20);
          glu::getDataTypeName
                    (*(DataType *)
                      ((long)&(pSVar19->super_ShaderRenderCase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar27 + 4));
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_658);
          psVar16 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_578.field_2._M_allocated_capacity = *psVar16;
            local_578.field_2._8_8_ = plVar13[3];
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          }
          else {
            local_578.field_2._M_allocated_capacity = *psVar16;
            local_578._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_578._M_string_length = plVar13[1];
          *plVar13 = (long)psVar16;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=(local_5c0,(string *)&local_578);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
          }
          iVar6 = glu::getDataTypeMatrixNumColumns
                            (*(DataType *)
                              ((long)&(local_660->super_ShaderRenderCase).super_TestCase.
                                      super_TestCase.super_TestNode._vptr_TestNode + lVar27 + 4));
          local_5d0 = (ulong)(uint)(iVar6 + (int)local_5d0);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"layout(location = 1) in ",0x18);
          pcVar24 = local_618;
          if (local_618 == (char *)0x0) {
            std::ios::clear((int)auStack_668 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x348);
          }
          else {
            sVar10 = strlen(local_618);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar24,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          pcVar24 = local_630;
          if (local_630 == (char *)0x0) {
            std::ios::clear((int)auStack_668 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x348);
          }
          else {
            sVar10 = strlen(local_630);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar24,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320," a_coords;\n",0xb);
          if ((local_660->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"layout(location = ",0x12);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") out ",6);
            pcVar24 = local_618;
            if (local_618 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_618);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," v_coords;\n",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"layout(location = ",0x12);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in ",5);
            pcVar24 = local_618;
            if (local_618 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_618);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar24 = local_630;
            if (local_630 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar10 = strlen(local_630);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," v_coords;\n",0xb);
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"coords","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_598,&local_578);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pcVar24 = "v_coords";
          if ((local_660->super_ShaderRenderCase).m_isVertexCase != false) {
            pcVar24 = "a_coords";
          }
          ppcVar12 = &local_368;
          if (local_620 == 0) {
            ppcVar12 = &local_388;
          }
          std::__cxx11::string::_M_replace((ulong)local_5c0,0,ppcVar12[1],(ulong)pcVar24);
        }
      }
      goto LAB_005c3080;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"const ",6);
    pcVar24 = local_618;
    if (local_618 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(local_618);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = local_630;
    if (local_630 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(local_630);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," in",3);
    poVar9 = (ostream *)std::ostream::operator<<(this_00,(int)local_620);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    switch(*(undefined4 *)
            ((long)&(local_660->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode + lVar27 + 4)) {
    case 1:
      de::floatToString_abi_cxx11_
                (&local_578,(de *)&DAT_00000001,
                 *(float *)((long)&sr::(anonymous_namespace)::s_constInFloat + local_620 * 4),
                 precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      break;
    case 2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_20;
      do {
        iVar6 = (int)uVar21;
        if (lVar18 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          iVar6 = extraout_EDX_06;
        }
        de::floatToString_abi_cxx11_(&local_578,(de *)&DAT_00000001,(float)local_3a0[lVar18],iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
        uVar21 = extraout_RDX_21;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          uVar21 = extraout_RDX_22;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      goto LAB_005c29c8;
    case 3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_11;
      do {
        iVar6 = (int)uVar21;
        if (lVar18 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          iVar6 = extraout_EDX_03;
        }
        de::floatToString_abi_cxx11_(&local_578,(de *)&DAT_00000001,(float)local_398[lVar18],iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
        uVar21 = extraout_RDX_12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          uVar21 = extraout_RDX_13;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      goto LAB_005c29c8;
    case 4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_14;
      do {
        iVar6 = (int)uVar21;
        if (lVar18 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          iVar6 = extraout_EDX_04;
        }
        de::floatToString_abi_cxx11_(&local_578,(de *)&DAT_00000001,(float)local_390[lVar18],iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
        uVar21 = extraout_RDX_15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          uVar21 = extraout_RDX_16;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
LAB_005c29c8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 5:
      local_658._M_dataplus._M_p = (pointer)0x0;
      local_658._M_string_length = 0;
      psVar14 = &local_658;
      puVar17 = local_3e8;
      lVar18 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)&(&psVar14->_M_dataplus)[lVar27]._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 == 1);
        puVar17 = puVar17 + 2;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      psVar14 = &local_658;
      uVar21 = extraout_RDX_02;
      lVar18 = 0;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if (lVar18 == 1 || lVar27 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_00;
          }
          de::floatToString_abi_cxx11_
                    (&local_578,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
          uVar21 = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_04;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 == 1);
        psVar14 = (string *)&psVar14->_M_string_length;
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 6:
      local_658._M_dataplus._M_p = (pointer)0x0;
      local_658._M_string_length = 0;
      local_658.field_2._M_allocated_capacity = 0;
      psVar14 = &local_658;
      lVar18 = 0;
      puVar17 = local_3e0;
      do {
        lVar27 = 0;
        psVar25 = psVar14;
        do {
          *(undefined4 *)&(psVar25->_M_dataplus)._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
          psVar25 = (string *)((long)&psVar25->_M_string_length + 4);
        } while (lVar27 == 1);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 2;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      psVar14 = &local_658;
      uVar21 = extraout_RDX_23;
      lVar18 = 0;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if (lVar18 == 1 || lVar27 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_07;
          }
          de::floatToString_abi_cxx11_
                    (&local_578,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
          uVar21 = extraout_RDX_24;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_25;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        psVar14 = (string *)((long)&psVar14->_M_string_length + 4);
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 7:
      local_658.field_2._M_allocated_capacity = 0;
      local_658.field_2._8_8_ = 0;
      local_658._M_dataplus._M_p = (pointer)0x0;
      local_658._M_string_length = 0;
      psVar14 = &local_658;
      lVar18 = 0;
      puVar17 = local_3d8;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4) =
               *(undefined4 *)((long)puVar17 + lVar27);
          lVar27 = lVar27 + 4;
        } while (lVar27 == 4);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 2;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      uVar21 = extraout_RDX_26;
      lVar18 = 0;
      puVar22 = auStack_668;
      do {
        puVar22 = puVar22 + 0x10;
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if (lVar18 == 1 || lVar27 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_08;
          }
          de::floatToString_abi_cxx11_
                    (&local_578,(de *)&DAT_00000001,*(float *)(puVar22 + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
          uVar21 = extraout_RDX_27;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_28;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 8:
      local_658._M_dataplus._M_p = (pointer)0x0;
      local_658._M_string_length = 0;
      local_658.field_2._M_allocated_capacity = 0;
      psVar14 = &local_658;
      puVar17 = local_3d0;
      lVar18 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)&(&psVar14->_M_dataplus)[lVar27]._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        puVar17 = puVar17 + 3;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      psVar14 = &local_658;
      lVar18 = 0;
      uVar21 = extraout_RDX_17;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if (lVar18 != 0 || lVar27 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_05;
          }
          de::floatToString_abi_cxx11_
                    (&local_578,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
          uVar21 = extraout_RDX_18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_19;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 == 1);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)&psVar14->_M_string_length;
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 9:
      local_578.field_2._M_allocated_capacity = 0;
      local_578.field_2._8_8_ = 0;
      local_578._M_dataplus._M_p = (pointer)0x0;
      local_578._M_string_length = 0;
      local_558 = local_558 & 0xffffffff00000000;
      lVar18 = 0;
      psVar14 = &local_578;
      puVar17 = local_3c8;
      do {
        lVar27 = 0;
        psVar25 = psVar14;
        do {
          *(undefined4 *)&(psVar25->_M_dataplus)._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
          psVar25 = (string *)((long)&psVar25->_M_string_length + 4);
        } while (lVar27 != 3);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 3;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_32;
      psVar14 = &local_578;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if ((int)lVar27 != 0 || (int)lVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_10;
          }
          de::floatToString_abi_cxx11_
                    (&local_658,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_658._M_dataplus._M_p,local_658._M_string_length);
          uVar21 = extraout_RDX_33;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_34;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)((long)&psVar14->_M_string_length + 4);
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 10:
      local_558 = 0;
      uStack_550 = 0;
      local_578.field_2._M_allocated_capacity = 0;
      local_578.field_2._8_8_ = 0;
      local_578._M_dataplus._M_p = (pointer)0x0;
      local_578._M_string_length = 0;
      lVar18 = 0;
      psVar14 = &local_578;
      puVar17 = local_3c0;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4) =
               *(undefined4 *)((long)puVar17 + lVar27);
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0xc);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 3;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_08;
      psVar14 = &local_578;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if ((int)lVar27 != 0 || (int)lVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_02;
          }
          de::floatToString_abi_cxx11_
                    (&local_658,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_658._M_dataplus._M_p,local_658._M_string_length);
          uVar21 = extraout_RDX_09;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_10;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)&psVar14->field_2;
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 0xb:
      local_658.field_2._M_allocated_capacity = 0;
      local_658.field_2._8_8_ = 0;
      local_658._M_dataplus._M_p = (pointer)0x0;
      local_658._M_string_length = 0;
      psVar14 = &local_658;
      puVar17 = local_3b8;
      lVar18 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)&(&psVar14->_M_dataplus)[lVar27]._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        puVar17 = puVar17 + 4;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
        bVar30 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      psVar14 = &local_658;
      lVar18 = 0;
      uVar21 = extraout_RDX_29;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if (lVar18 != 0 || lVar27 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_09;
          }
          de::floatToString_abi_cxx11_
                    (&local_578,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
          uVar21 = extraout_RDX_30;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_31;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 == 1);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)&psVar14->_M_string_length;
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 0xc:
      local_558 = 0;
      uStack_550 = 0;
      local_578.field_2._M_allocated_capacity = 0;
      local_578.field_2._8_8_ = 0;
      local_578._M_dataplus._M_p = (pointer)0x0;
      local_578._M_string_length = 0;
      lVar18 = 0;
      psVar14 = &local_578;
      puVar17 = local_3b0;
      do {
        lVar27 = 0;
        psVar25 = psVar14;
        do {
          *(undefined4 *)&(psVar25->_M_dataplus)._M_p = puVar17[lVar27];
          lVar27 = lVar27 + 1;
          psVar25 = (string *)((long)&psVar25->_M_string_length + 4);
        } while (lVar27 != 4);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 4;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      std::ostream::operator<<(poVar9,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX;
      psVar14 = &local_578;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if ((int)lVar27 != 0 || (int)lVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX;
          }
          de::floatToString_abi_cxx11_
                    (&local_658,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_658._M_dataplus._M_p,local_658._M_string_length);
          uVar21 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_01;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)((long)&psVar14->_M_string_length + 4);
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 0xd:
      local_548 = 0;
      uStack_540 = 0;
      local_558 = 0;
      uStack_550 = 0;
      local_578.field_2._M_allocated_capacity = 0;
      local_578.field_2._8_8_ = 0;
      local_578._M_dataplus._M_p = (pointer)0x0;
      local_578._M_string_length = 0;
      lVar18 = 0;
      psVar14 = &local_578;
      puVar17 = local_3a8;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4) =
               *(undefined4 *)((long)puVar17 + lVar27);
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x10);
        lVar18 = lVar18 + 1;
        puVar17 = puVar17 + 4;
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 4);
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar18 = 0;
      uVar21 = extraout_RDX_05;
      psVar14 = &local_578;
      do {
        lVar27 = 0;
        do {
          iVar6 = (int)uVar21;
          if ((int)lVar27 != 0 || (int)lVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar6 = extraout_EDX_01;
          }
          de::floatToString_abi_cxx11_
                    (&local_658,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar14->_M_dataplus)._M_p + lVar27 * 4),iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_658._M_dataplus._M_p,local_658._M_string_length);
          uVar21 = extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
            uVar21 = extraout_RDX_07;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        lVar18 = lVar18 + 1;
        psVar14 = (string *)&psVar14->field_2;
      } while (lVar18 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
    local_610 = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"in","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_578);
    std::ostream::operator<<(&local_578,(int)local_620);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_578);
    std::ios_base::~ios_base(local_508);
    uVar26 = 0xf;
    if (local_610 != local_600) {
      uVar26 = local_600[0];
    }
    if (uVar26 < (ulong)(local_5e8 + local_608)) {
      uVar26 = 0xf;
      if (local_5f0 != local_5e0) {
        uVar26 = local_5e0[0];
      }
      if (uVar26 < (ulong)(local_5e8 + local_608)) goto LAB_005c2fad;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_5f0,0,(char *)0x0,(ulong)local_610);
    }
    else {
LAB_005c2fad:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_610,(ulong)local_5f0);
    }
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    psVar16 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_658.field_2._M_allocated_capacity = *psVar16;
      local_658.field_2._8_8_ = puVar11[3];
    }
    else {
      local_658.field_2._M_allocated_capacity = *psVar16;
      local_658._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_658._M_string_length = puVar11[1];
    *puVar11 = psVar16;
    puVar11[1] = 0;
    *(undefined1 *)psVar16 = 0;
    std::__cxx11::string::operator=(local_5c0,(string *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
    if (local_5f0 != local_5e0) {
      operator_delete(local_5f0,local_5e0[0] + 1);
    }
    if (local_610 != local_600) {
      operator_delete(local_610,local_600[0] + 1);
    }
LAB_005c3080:
    lVar18 = local_620 + 1;
    local_3a8 = local_3a8 + 0x10;
    local_3b0 = local_3b0 + 0xc;
    local_3b8 = local_3b8 + 8;
    local_3c0 = local_3c0 + 0xc;
    local_3c8 = local_3c8 + 9;
    local_3d0 = local_3d0 + 6;
    local_3d8 = local_3d8 + 8;
    local_3e0 = local_3e0 + 6;
    local_3e8 = local_3e8 + 4;
    local_390 = local_390 + 4;
    local_398 = local_398 + 3;
    local_3a0 = local_3a0 + 2;
  } while (lVar18 != local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((local_660->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tdEQP_FragColor = v_color;\n",0x1b);
  }
  else if (local_598.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_598.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar28 = local_598.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_",3);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(pbVar28->_M_dataplus)._M_p,pbVar28->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"a_",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(pbVar28->_M_dataplus)._M_p,pbVar28->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      pbVar28 = pbVar28 + 1;
    } while (pbVar28 !=
             local_598.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_660->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," tmpValue = ",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_388,local_380);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    std::__cxx11::string::_M_replace((ulong)&local_5b8,0,local_5b0,0xb4ca70);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_5b8);
  }
  psVar23 = (string *)&local_348;
  std::__cxx11::string::_M_assign(psVar23);
  OVar5 = MatrixCaseUtils::getOperationType(local_660->m_op);
  poVar9 = (ostream *)this_00;
  switch(OVar5) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_5b8,(long)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_5b8,(long)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    ppcVar12 = &local_348;
    goto LAB_005c3a52;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    psVar23 = (string *)&local_5b8;
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_5b8,(long)local_5b0);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    lVar18 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar24,sVar10);
    goto LAB_005c3b42;
  case OPERATIONTYPE_UNARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    ppcVar12 = &local_5b8;
LAB_005c3a52:
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,*ppcVar12,(long)ppcVar12[1]);
    lVar18 = 3;
    local_3f8 = ");\n";
    goto LAB_005c3b42;
  case OPERATIONTYPE_ASSIGNMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar24 = glu::getPrecisionName(local_624);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar24 = glu::getDataTypeName(local_664);
    if (pcVar24 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_5b8,(long)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tres ",5);
    pcVar24 = MatrixCaseUtils::getOperationName(local_660->m_op);
    sVar10 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    break;
  default:
    goto switchD_005c33fa_default;
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,*(char **)psVar23,*(long *)(psVar23 + 8));
  lVar18 = 2;
LAB_005c3b42:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_3f8,lVar18);
switchD_005c33fa_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
  pcVar24 = "dEQP_FragColor";
  bVar30 = (local_660->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar30) {
    pcVar24 = "v_color";
  }
  lVar18 = 0xe;
  if (bVar30) {
    lVar18 = 7;
  }
  pSVar19 = local_660;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
  if (local_660->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(",5);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_578,&local_664,(DataType *)0xb02a40,(char *)pSVar19);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", 1.0) + vec4(",0xe);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_658,&local_664,(DataType *)"tmpValue",(char *)pSVar19);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_658._M_dataplus._M_p,local_658._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", 0.0);\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(",5);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_578,&local_664,(DataType *)0xb02a40,(char *)pSVar19);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_578._M_dataplus._M_p,local_578._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", 1.0);\n",8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  pSVar19 = local_660;
  std::__cxx11::string::operator=
            ((string *)&(local_660->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_578)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar19->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,CONCAT71(uStack_5a7,local_5a8) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void ShaderMatrixCase::setupShader (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	static const std::string header =
		"#version 310 es\n";

	vtx << header;
	frag << header;

	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}

	// Input declarations.
	deUint32 uniformBinding = 0;
	deUint32 padding = 0;
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			if (isDataTypeMatrix(in.dataType))
			{
				vtx << "layout(location = " << 4 + inNdx + padding << ") in " << precName << " " << typeName << " a_";
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + inNdx + padding << ") out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "layout(location = " << 1 + inNdx + padding << ") in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
				padding += getDataTypeMatrixNumColumns(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "layout(location = 1) in " << precName << " " << typeName << " a_coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + padding << ") out " << precName << " " << typeName << " v_coords;\n";
					frag << "layout(location = " << 1 + padding << ") in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "layout(std140, set = 0, binding = " << uniformBinding++ <<  ") uniform buffer"<< inNdx <<" { " << precName << " " << typeName << " u_in" << inNdx << "; };\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();
}